

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::BaseRAPass::blockEntryAssigned(BaseRAPass *this,RAAssignment *as)

{
  BitWordIterator<unsigned_int> BVar1;
  uint32_t physId;
  uint32_t workId;
  undefined8 in_RAX;
  RAWorkReg *pRVar2;
  uint32_t group;
  long lVar3;
  undefined4 uStack_38;
  BitWordIterator<unsigned_int> it;
  
  _uStack_38 = in_RAX;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    if (this->_strategy[lVar3]._type != '\0') {
      BVar1._bitWord = RAAssignment::assigned(as,(uint32_t)lVar3);
      _uStack_38 = CONCAT44(BVar1._bitWord,uStack_38);
      while (BVar1._bitWord != 0) {
        physId = Support::BitWordIterator<unsigned_int>::next(&it);
        workId = RAAssignment::physToWorkId(as,(uint32_t)lVar3,physId);
        pRVar2 = workRegById(this,workId);
        pRVar2->_allocatedMask = pRVar2->_allocatedMask | 1 << ((byte)physId & 0x1f);
        BVar1._bitWord = it._bitWord;
      }
    }
  }
  return 0;
}

Assistant:

Error BaseRAPass::blockEntryAssigned(const RAAssignment& as) noexcept {
  // Complex allocation strategy requires to record register assignments upon
  // block entry (or per shared state).
  for (uint32_t group = 0; group < BaseReg::kGroupVirt; group++) {
    if (!_strategy[group].isComplex())
      continue;

    Support::BitWordIterator<uint32_t> it(as.assigned(group));
    while (it.hasNext()) {
      uint32_t physId = it.next();
      uint32_t workId = as.physToWorkId(group, physId);

      RAWorkReg* workReg = workRegById(workId);
      workReg->addAllocatedMask(Support::bitMask(physId));
    }
  }

  return kErrorOk;
}